

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderStorageBufferObjectTests.cpp
# Opt level: O0

long __thiscall
gl4cts::anon_unknown_0::AdvancedUnsizedArrayLength2::Run(AdvancedUnsizedArrayLength2 *this)

{
  int iVar1;
  bool bVar2;
  GLuint GVar3;
  uint uVar4;
  reference pvVar5;
  void *pvVar6;
  long lVar7;
  CallLogWrapper *this_00;
  uint local_33c;
  int i_2;
  int i_1;
  bool status;
  int *dataout;
  int i;
  undefined1 local_310 [8];
  vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> data;
  int bufsize [8] [2];
  int std140struct [8];
  int std430struct [8];
  int mindw [4] [8];
  int scalars [4] [8];
  int columns [4] [8];
  int sizes [8];
  string glsl_cs;
  string glsl_fs_1;
  string glsl_vs_1;
  undefined1 local_68 [8];
  string glsl_fs;
  string glsl_vs;
  GLint minA;
  GLint blocksC;
  int kBufs;
  int kSize;
  AdvancedUnsizedArrayLength2 *this_local;
  
  (*(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[9]
  )();
  if ((this->stage == 0) &&
     (bVar2 = ShaderStorageBufferObjectBase::SupportedInVS
                        (&this->super_ShaderStorageBufferObjectBase,8), !bVar2)) {
    return (long)(AdvancedUnsizedArrayLength2 *)0x10;
  }
  glu::CallLogWrapper::glGetIntegerv
            (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x90db,(GLint *)(glsl_vs.field_2._M_local_buf + 0xc));
  glu::CallLogWrapper::glGetIntegerv
            (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x90df,(GLint *)(glsl_vs.field_2._M_local_buf + 8));
  if ((int)glsl_vs.field_2._12_4_ < 8) {
    return (long)(AdvancedUnsizedArrayLength2 *)0x10;
  }
  if (this->stage == 0) {
    gl4cts::(anonymous_namespace)::AdvancedUnsizedArrayLength2::BuildShader_abi_cxx11_
              ((string *)((long)&glsl_fs.field_2 + 8),this);
    gl4cts::(anonymous_namespace)::AdvancedUnsizedArrayLength2::BuildShaderPT_abi_cxx11_
              ((string *)local_68,this,1);
    GVar3 = ShaderStorageBufferObjectBase::CreateProgram
                      (&this->super_ShaderStorageBufferObjectBase,
                       (string *)((long)&glsl_fs.field_2 + 8),(string *)local_68);
    this->m_program = GVar3;
    std::__cxx11::string::~string((string *)local_68);
    std::__cxx11::string::~string((string *)(glsl_fs.field_2._M_local_buf + 8));
  }
  else if (this->stage == 1) {
    gl4cts::(anonymous_namespace)::AdvancedUnsizedArrayLength2::BuildShaderPT_abi_cxx11_
              ((string *)((long)&glsl_fs_1.field_2 + 8),this,0);
    gl4cts::(anonymous_namespace)::AdvancedUnsizedArrayLength2::BuildShader_abi_cxx11_
              ((string *)((long)&glsl_cs.field_2 + 8),this);
    GVar3 = ShaderStorageBufferObjectBase::CreateProgram
                      (&this->super_ShaderStorageBufferObjectBase,
                       (string *)((long)&glsl_fs_1.field_2 + 8),
                       (string *)((long)&glsl_cs.field_2 + 8));
    this->m_program = GVar3;
    std::__cxx11::string::~string((string *)(glsl_cs.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(glsl_fs_1.field_2._M_local_buf + 8));
  }
  else {
    gl4cts::(anonymous_namespace)::AdvancedUnsizedArrayLength2::BuildShader_abi_cxx11_
              ((string *)(sizes + 6),this);
    GVar3 = ShaderStorageBufferObjectBase::CreateProgramCS
                      (&this->super_ShaderStorageBufferObjectBase,(string *)(sizes + 6));
    this->m_program = GVar3;
    std::__cxx11::string::~string((string *)(sizes + 6));
  }
  glu::CallLogWrapper::glLinkProgram
            (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,this->m_program);
  bVar2 = ShaderStorageBufferObjectBase::CheckProgram
                    (&this->super_ShaderStorageBufferObjectBase,this->m_program);
  if (!bVar2) {
    this_local = (AdvancedUnsizedArrayLength2 *)&DAT_ffffffffffffffff;
    return (long)this_local;
  }
  this_00 = &(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
             super_CallLogWrapper;
  glu::CallLogWrapper::glUseProgram(this_00,this->m_program);
  glu::CallLogWrapper::glGenBuffers(this_00,8,this->m_storage_buffer);
  sizes[2] = 0x17;
  sizes[3] = 0x7b;
  sizes[4] = 0x1a3;
  sizes[5] = 8;
  columns[3][6] = 7;
  columns[3][7] = 5;
  sizes[0] = 3;
  sizes[1] = 4;
  columns[3][2] = 1;
  columns[3][3] = 1;
  columns[3][4] = 1;
  columns[3][5] = 1;
  columns[2][6] = 1;
  columns[2][7] = 1;
  columns[3][0] = 1;
  columns[3][1] = 1;
  columns[2][2] = 3;
  columns[2][3] = 2;
  columns[2][4] = 2;
  columns[2][5] = 1;
  columns[1][6] = 2;
  columns[1][7] = 3;
  columns[2][0] = 4;
  columns[2][1] = 4;
  columns[1][2] = 2;
  columns[1][3] = 3;
  columns[1][4] = 4;
  columns[1][5] = 1;
  columns[0][6] = 2;
  columns[0][7] = 3;
  columns[1][0] = 4;
  columns[1][1] = 4;
  columns[0][2] = 1;
  columns[0][3] = 1;
  columns[0][4] = 1;
  columns[0][5] = 1;
  scalars[3][6] = 1;
  scalars[3][7] = 1;
  columns[0][0] = 1;
  columns[0][1] = 1;
  scalars[3][2] = 1;
  scalars[3][3] = 1;
  scalars[3][4] = 1;
  scalars[3][5] = 1;
  scalars[2][6] = 1;
  scalars[2][7] = 1;
  scalars[3][0] = 1;
  scalars[3][1] = 1;
  scalars[2][2] = 2;
  scalars[2][3] = 4;
  scalars[2][4] = 4;
  scalars[2][5] = 1;
  scalars[1][6] = 2;
  scalars[1][7] = 4;
  scalars[2][0] = 4;
  scalars[2][1] = 4;
  scalars[1][2] = 4;
  scalars[1][3] = 2;
  scalars[1][4] = 2;
  scalars[1][5] = 1;
  scalars[0][6] = 2;
  scalars[0][7] = 4;
  scalars[1][0] = 4;
  scalars[1][1] = 4;
  scalars[0][2] = 2;
  scalars[0][3] = 2;
  scalars[0][4] = 4;
  scalars[0][5] = 1;
  mindw[3][6] = 4;
  mindw[3][7] = 4;
  scalars[0][0] = 4;
  scalars[0][1] = 4;
  mindw[3][2] = 0x51;
  mindw[3][3] = 0x7f;
  mindw[3][4] = 0x17d;
  mindw[3][5] = 1;
  mindw[2][6] = 4;
  mindw[2][7] = 0xb;
  mindw[3][0] = 0x23;
  mindw[3][1] = 0x23;
  mindw[2][2] = 6;
  mindw[2][3] = 6;
  mindw[2][4] = 8;
  mindw[2][5] = 1;
  mindw[1][6] = 4;
  mindw[1][7] = 9;
  mindw[2][0] = 0x10;
  mindw[2][1] = 0x10;
  mindw[1][2] = 6;
  mindw[1][3] = 6;
  mindw[1][4] = 8;
  mindw[1][5] = 1;
  mindw[0][6] = 4;
  mindw[0][7] = 9;
  mindw[1][0] = 0x10;
  mindw[1][1] = 0x10;
  mindw[0][2] = 2;
  mindw[0][3] = 2;
  mindw[0][4] = 4;
  mindw[0][5] = 1;
  mindw[0][0] = 3;
  mindw[0][1] = 3;
  std140struct[6] = 4;
  std140struct[7] = 0x10;
  std140struct[2] = 0x90;
  std140struct[3] = 0x50;
  std140struct[4] = 0x1b0;
  std140struct[5] = 1;
  bufsize[7][0] = 4;
  bufsize[7][1] = 0x10;
  std140struct[0] = 0x3c;
  std140struct[1] = 0x3c;
  bufsize[5][0] = 0;
  bufsize[5][1] = 0;
  bufsize[6][0] = 0;
  bufsize[6][1] = 0;
  bufsize[3][0] = 0;
  bufsize[3][1] = 0;
  bufsize[4][0] = 0;
  bufsize[4][1] = 0;
  bufsize[1][0] = 0;
  bufsize[1][1] = 0;
  bufsize[2][0] = 0;
  bufsize[2][1] = 0;
  data.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bufsize[0][0] = 0;
  bufsize[0][1] = 0;
  tcu::Vector<int,_4>::Vector((Vector<int,_4> *)&i,0x29);
  std::allocator<tcu::Vector<int,_4>_>::allocator
            ((allocator<tcu::Vector<int,_4>_> *)((long)&dataout + 7));
  std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::vector
            ((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)local_310,100000,
             (Vector<int,_4> *)&i,(allocator<tcu::Vector<int,_4>_> *)((long)&dataout + 7));
  std::allocator<tcu::Vector<int,_4>_>::~allocator
            ((allocator<tcu::Vector<int,_4>_> *)((long)&dataout + 7));
  for (dataout._0_4_ = 0; (int)(GLuint)dataout < 8; dataout._0_4_ = (GLuint)dataout + 1) {
    if (this->layout == 1) {
      bufsize[(long)(int)(GLuint)dataout + -1][1] =
           scalars[(long)this->etype + 3][(long)(int)(GLuint)dataout + 6] * 4 *
           mindw[(long)this->etype + 3][(long)(int)(GLuint)dataout + 6];
      if (this->etype == 3) {
        bufsize[(long)(int)(GLuint)dataout + -1][1] =
             std140struct[(long)(int)(GLuint)dataout + 6] << 2;
      }
    }
    else if (this->layout == 0) {
      bufsize[(long)(int)(GLuint)dataout + -1][1] =
           scalars[(long)this->etype + 3][(long)(int)(GLuint)dataout + 6] << 4;
      if (this->etype == 3) {
        bufsize[(long)(int)(GLuint)dataout + -1][1] =
             std140struct[(long)(int)(GLuint)dataout + -2] << 2;
      }
    }
    else {
      bufsize[(long)(int)(GLuint)dataout + -1][1] =
           mindw[(long)this->etype + -1][(long)(int)(GLuint)dataout + 6] << 2;
    }
    bufsize[(long)(int)(GLuint)dataout + -1][0] =
         sizes[(long)(int)(GLuint)dataout + -2] * bufsize[(long)(int)(GLuint)dataout + -1][1];
    if (((GLuint)dataout == 7) || (this->bind_seq == 0)) {
      glu::CallLogWrapper::glBindBufferBase
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x90d2,(GLuint)dataout,
                 this->m_storage_buffer[(int)(GLuint)dataout]);
      iVar1 = bufsize[(long)(int)(GLuint)dataout + -1][0];
      pvVar5 = std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::operator[]
                         ((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)
                          local_310,0);
      glu::CallLogWrapper::glBufferData
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x90d2,(long)iVar1,pvVar5,0x88ea);
    }
    else {
      glu::CallLogWrapper::glBindBuffer
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x90d2,this->m_storage_buffer[(int)(GLuint)dataout]);
      iVar1 = bufsize[(long)(int)(GLuint)dataout + -1][0];
      pvVar5 = std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::operator[]
                         ((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)
                          local_310,0);
      glu::CallLogWrapper::glBufferData
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x90d2,(long)iVar1,pvVar5,0x88ea);
      if (this->bind_seq == 1) {
        glu::CallLogWrapper::glBindBufferBase
                  (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0x90d2,(GLuint)dataout,
                   this->m_storage_buffer[(int)(GLuint)dataout]);
      }
      else if ((this->bind_seq == 2) &&
              ((int)glsl_vs.field_2._8_4_ <= bufsize[(long)(int)(GLuint)dataout + -1][1] * 2)) {
        lVar7 = (long)(int)(GLuint)dataout;
        glu::CallLogWrapper::glBindBufferRange
                  (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0x90d2,(GLuint)dataout,this->m_storage_buffer[lVar7],
                   (long)(bufsize[lVar7 + -1][1] * 2),
                   (long)(bufsize[lVar7 + -1][0] + bufsize[lVar7 + -1][1] * -2));
      }
      else {
        lVar7 = (long)(int)(GLuint)dataout;
        glu::CallLogWrapper::glBindBufferRange
                  (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0x90d2,(GLuint)dataout,this->m_storage_buffer[lVar7],0,
                   (long)(bufsize[lVar7 + -1][0] + bufsize[lVar7 + -1][1] * -2));
      }
    }
  }
  if (this->stage == 2) {
    glu::CallLogWrapper::glDispatchCompute
              (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,1,1,1);
  }
  else {
    glu::CallLogWrapper::glGenVertexArrays
              (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,1,&this->m_vertex_array);
    glu::CallLogWrapper::glBindVertexArray
              (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,this->m_vertex_array);
    glu::CallLogWrapper::glDrawArrays
              (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0,0,1);
  }
  glu::CallLogWrapper::glMemoryBarrier
            (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x200);
  glu::CallLogWrapper::glBindBuffer
            (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x90d2,this->m_storage_buffer[7]);
  pvVar6 = glu::CallLogWrapper::glMapBufferRange
                     (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper
                       .super_CallLogWrapper,0x90d2,0,(long)(sizes[5] << 2),1);
  if (pvVar6 == (void *)0x0) {
    this_local = (AdvancedUnsizedArrayLength2 *)&DAT_ffffffffffffffff;
    goto LAB_00ff9c04;
  }
  bVar2 = true;
  for (local_33c = 0; (int)local_33c < 7; local_33c = local_33c + 1) {
    if ((this->other_members & 1U) != 0) {
      sizes[(long)(int)local_33c + -2] = sizes[(long)(int)local_33c + -2] + -1;
    }
    if ((this->bind_seq == 3) || (this->bind_seq == 2)) {
      sizes[(long)(int)local_33c + -2] = sizes[(long)(int)local_33c + -2] + -2;
    }
    if (((this->layout == 0) || (this->layout == 1)) &&
       (*(int *)((long)pvVar6 + (long)(int)local_33c * 4) != sizes[(long)(int)local_33c + -2])) {
      anon_unknown_0::Output
                ("Array %d length is %d should be %d.\n",(ulong)local_33c,
                 (ulong)*(uint *)((long)pvVar6 + (long)(int)local_33c * 4),
                 (ulong)(uint)sizes[(long)(int)local_33c + -2]);
      bVar2 = false;
    }
    if (((this->layout == 3) || (this->layout == 2)) &&
       (sizes[(long)(int)local_33c + -2] < *(int *)((long)pvVar6 + (long)(int)local_33c * 4))) {
      anon_unknown_0::Output
                ("Array %d length is %d should be not greater that %d.\n",(ulong)local_33c,
                 (ulong)*(uint *)((long)pvVar6 + (long)(int)local_33c * 4),
                 (ulong)(uint)sizes[(long)(int)local_33c + -2]);
      bVar2 = false;
    }
  }
  glu::CallLogWrapper::glUnmapBuffer
            (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x90d2);
  if ((this->length_as_index & 1U) != 0) {
    glu::CallLogWrapper::glBindBuffer
              (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x90d2,this->m_storage_buffer[4]);
    pvVar6 = glu::CallLogWrapper::glMapBufferRange
                       (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.
                         super_GLWrapper.super_CallLogWrapper,0x90d2,0,(long)bufsize[3][0],1);
    if (pvVar6 == (void *)0x0) {
      this_local = (AdvancedUnsizedArrayLength2 *)&DAT_ffffffffffffffff;
      goto LAB_00ff9c04;
    }
    uVar4 = (sizes[2] + -2) * columns[this->etype][2] * scalars[this->etype][2];
    if (*(int *)((long)pvVar6 + (long)(int)uVar4 * 4) != 0x52) {
      anon_unknown_0::Output
                ("Array 4 index %d is %d should be 82.\n",(ulong)uVar4,
                 (ulong)*(uint *)((long)pvVar6 + (long)(int)uVar4 * 4));
      bVar2 = false;
    }
    glu::CallLogWrapper::glUnmapBuffer
              (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x90d2);
    glu::CallLogWrapper::glBindBuffer
              (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x90d2,this->m_storage_buffer[6]);
    pvVar6 = glu::CallLogWrapper::glMapBufferRange
                       (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.
                         super_GLWrapper.super_CallLogWrapper,0x90d2,0,(long)bufsize[5][0],1);
    if (pvVar6 == (void *)0x0) {
      this_local = (AdvancedUnsizedArrayLength2 *)&DAT_ffffffffffffffff;
      goto LAB_00ff9c04;
    }
    uVar4 = (sizes[4] + -2) * columns[this->etype][4] * scalars[this->etype][4];
    if (*(int *)((long)pvVar6 + (long)(int)uVar4 * 4) != 0x52) {
      anon_unknown_0::Output
                ("Array 6 index %d is %d should be 82.\n",(ulong)uVar4,
                 (ulong)*(uint *)((long)pvVar6 + (long)(int)uVar4 * 4));
      bVar2 = false;
    }
    glu::CallLogWrapper::glUnmapBuffer
              (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x90d2);
  }
  if (bVar2) {
    this_local = (AdvancedUnsizedArrayLength2 *)0x0;
  }
  else {
    this_local = (AdvancedUnsizedArrayLength2 *)&DAT_ffffffffffffffff;
  }
LAB_00ff9c04:
  std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::~vector
            ((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)local_310);
  return (long)this_local;
}

Assistant:

virtual long Run()
	{
		const int kSize = 100000;
		const int kBufs = 8;
		SetPath();
		if (stage == vertex && !SupportedInVS(8))
			return NOT_SUPPORTED;
		GLint blocksC;
		glGetIntegerv(GL_MAX_COMPUTE_SHADER_STORAGE_BLOCKS, &blocksC);
		GLint minA;
		glGetIntegerv(GL_SHADER_STORAGE_BUFFER_OFFSET_ALIGNMENT, &minA);
		if (blocksC < kBufs)
			return NOT_SUPPORTED;
		if (stage == vertex)
		{
			std::string glsl_vs = BuildShader();
			std::string glsl_fs = BuildShaderPT(fragment);
			m_program			= CreateProgram(glsl_vs, glsl_fs);
		}
		else if (stage == fragment)
		{
			std::string glsl_vs = BuildShaderPT(vertex);
			std::string glsl_fs = BuildShader();
			m_program			= CreateProgram(glsl_vs, glsl_fs);
		}
		else
		{ // compute
			std::string glsl_cs = BuildShader();
			m_program			= CreateProgramCS(glsl_cs);
		}
		glLinkProgram(m_program);
		if (!CheckProgram(m_program))
			return ERROR;
		glUseProgram(m_program);

		glGenBuffers(kBufs, m_storage_buffer);
		int sizes[kBufs] = { 7, 5, 3, 4, 23, 123, 419, 8 };

		int columns[4][kBufs] = { { 1, 1, 1, 1, 1, 1, 1, 1 },   // vector: 1 col
								  { 2, 3, 4, 4, 2, 3, 4, 1 },   // mat: # of cols
								  { 2, 3, 4, 4, 3, 2, 2, 1 },   // RM mat: # of rows
								  { 1, 1, 1, 1, 1, 1, 1, 1 } }; // structure: not used

		int scalars[4][kBufs] = { { 4, 4, 4, 4, 2, 2, 4, 1 },   //vector: size
								  { 2, 4, 4, 4, 4, 2, 2, 1 },   //matrix column_major: rows
								  { 2, 4, 4, 4, 2, 4, 4, 1 },   //matrix row_major: columns
								  { 1, 1, 1, 1, 1, 1, 1, 1 } }; //structure: not used

		int mindw[4][kBufs] = { { 3, 4, 3, 3, 2, 2, 4, 1 }, // # of real 32bit items
								{ 4, 9, 16, 16, 6, 6, 8, 1 },
								{ 4, 9, 16, 16, 6, 6, 8, 1 },
								{ 4, 11, 35, 35, 81, 127, 381, 1 } };
		int std430struct[kBufs] = { 4, 16, 48, 48, 88, 68, 264, 1 };
		int std140struct[kBufs] = { 4, 16, 60, 60, 144, 80, 432, 1 };
		int bufsize[kBufs][2]   = { { 0 } };

		std::vector<ivec4> data(kSize, ivec4(41));
		for (int i = 0; i < kBufs; ++i)
		{
			if (layout == std430)
			{
				bufsize[i][1] = 4 * columns[etype][i] * scalars[etype][i];
				if (etype == structure)
				{
					bufsize[i][1] = 4 * std430struct[i];
				}
			}
			else if (layout == std140)
			{
				bufsize[i][1] = 4 * columns[etype][i] * 4;
				if (etype == structure)
				{
					bufsize[i][1] = 4 * std140struct[i];
				}
			}
			else
			{
				bufsize[i][1] = 4 * mindw[etype][i];
			}
			bufsize[i][0] = sizes[i] * bufsize[i][1];
			if (i == kBufs - 1 || bind_seq == bindbasebefore)
			{ // never trim feedback storage
				glBindBufferBase(GL_SHADER_STORAGE_BUFFER, i, m_storage_buffer[i]);
				glBufferData(GL_SHADER_STORAGE_BUFFER, bufsize[i][0], &data[0], GL_DYNAMIC_COPY);
			}
			else
			{
				glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer[i]);
				glBufferData(GL_SHADER_STORAGE_BUFFER, bufsize[i][0], &data[0], GL_DYNAMIC_COPY);
				if (bind_seq == bindbaseafter)
				{
					glBindBufferBase(GL_SHADER_STORAGE_BUFFER, i, m_storage_buffer[i]);
				}
				else if (bind_seq == bindrangeoffset && 2 * bufsize[i][1] >= minA)
				{
					glBindBufferRange(GL_SHADER_STORAGE_BUFFER, i, m_storage_buffer[i], 2 * bufsize[i][1],
									  bufsize[i][0] - 2 * bufsize[i][1]); // without 2 elements
				}
				else
				{ // bind_seq == bindrangesize || 2*bufsize[i][1] < minA
					glBindBufferRange(GL_SHADER_STORAGE_BUFFER, i, m_storage_buffer[i], 0,
									  bufsize[i][0] - 2 * bufsize[i][1]); // without 2 elements
				}
			}
		}

		if (stage != compute)
		{
			glGenVertexArrays(1, &m_vertex_array);
			glBindVertexArray(m_vertex_array);
			glDrawArrays(GL_POINTS, 0, 1);
		}
		else
		{
			glDispatchCompute(1, 1, 1);
		}
		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);

		glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer[kBufs - 1]);
		int* dataout = (int*)glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, 4 * sizes[kBufs - 1], GL_MAP_READ_BIT);
		if (!dataout)
			return ERROR;
		bool status = true;
		for (int i = 0; i < kBufs - 1; ++i)
		{
			if (other_members)
				sizes[i] -= 1; // space consumed by a pad
			if (bind_seq == bindrangesize || bind_seq == bindrangeoffset)
				sizes[i] -= 2; // space constrained by offset of range size
			if ((layout == std140 || layout == std430) && dataout[i] != sizes[i])
			{
				Output("Array %d length is %d should be %d.\n", i, dataout[i], sizes[i]);
				status = false;
			}
			if ((layout == packed || layout == shared) && (dataout[i] > sizes[i]))
			{
				Output("Array %d length is %d should be not greater that %d.\n", i, dataout[i], sizes[i]);
				status = false;
			}
		}
		glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);

		if (length_as_index)
		{
			glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer[4]);
			dataout = (int*)glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, bufsize[4][0], GL_MAP_READ_BIT);
			if (!dataout)
				return ERROR;
			int i = (sizes[4] - 2) * columns[etype][4] * scalars[etype][4];
			if (dataout[i] != 82)
			{
				Output("Array 4 index %d is %d should be 82.\n", i, dataout[i]);
				status = false;
			}
			glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);
			glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer[6]);
			dataout = (int*)glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, bufsize[6][0], GL_MAP_READ_BIT);
			if (!dataout)
				return ERROR;
			i = (sizes[6] - 2) * columns[etype][6] * scalars[etype][6];
			if (dataout[i] != 82)
			{
				Output("Array 6 index %d is %d should be 82.\n", i, dataout[i]);
				status = false;
			}
			glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);
		}

		if (!status)
			return ERROR;

		return NO_ERROR;
	}